

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O2

int __thiscall network::init(network *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  fepoll *this_00;
  
  this_00 = (fepoll *)operator_new(0x10);
  fepoll::fepoll(this_00);
  this->frame_ = (iframe *)this_00;
  iVar1 = (**(this_00->super_iframe)._vptr_iframe)(this_00);
  if ((char)iVar1 == '\0') {
    (*this->frame_->_vptr_iframe[1])();
  }
  return iVar1;
}

Assistant:

bool network::init()
{
#ifdef __linux__
    frame_ = new fepoll();
#endif
#ifdef __APPLE__
    frame_ = new fkqueue();
#endif
#ifdef _MSC_VER
    frame_ = new fselect();
#endif
    if (!frame_->init())
    {
        frame_->release();
        return false;
    }
    return true;
}